

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O3

bool __thiscall
tinygltf::TinyGLTF::WriteGltfSceneToFile
          (TinyGLTF *this,Model *model,string *filename,bool embedImages,bool embedBuffers,
          bool prettyPrint,bool writeBinary)

{
  WriteImageDataFunction *WriteImageData;
  uint uVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long *plVar7;
  undefined8 *puVar8;
  ulong uVar9;
  ulong uVar10;
  undefined7 in_register_00000009;
  ulong uVar11;
  long *plVar12;
  string *psVar13;
  uint __len;
  undefined8 uVar14;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  uint __val;
  pointer pBVar15;
  undefined8 uVar16;
  json buffer;
  string defaultBinFileExt;
  JsonDocument output;
  string binUri;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  usedUris;
  json buffers;
  string defaultBinFilename;
  string __str;
  string baseDir;
  json images;
  undefined1 local_390 [8];
  json_value local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  undefined1 local_370 [8];
  json_value local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  undefined1 local_340 [8];
  json_value local_338;
  string *local_330;
  undefined4 local_324;
  uint local_320;
  uint local_31c;
  undefined1 local_318 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  undefined8 local_2e8;
  undefined8 local_2d8;
  string *local_2d0;
  TinyGLTF *local_2c8;
  undefined1 local_2c0 [8];
  json_value local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  char *local_290 [2];
  char local_280 [16];
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  string local_250;
  undefined1 local_230 [8];
  json_value local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220 [14];
  ios_base local_138 [264];
  
  local_320 = (uint)CONCAT71(in_register_00000089,prettyPrint);
  uVar11 = CONCAT71(in_register_00000081,embedBuffers) & 0xffffffff;
  local_324 = (undefined4)CONCAT71(in_register_00000009,embedImages);
  local_340[0] = null;
  local_338.object = (object_t *)0x0;
  local_2c8 = this;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_340);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_340);
  std::__cxx11::string::find_last_of((char *)filename,0x2e23b7,0xffffffffffffffff);
  local_330 = filename;
  std::__cxx11::string::substr((ulong)&local_2b0,(ulong)filename);
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,".bin","");
  lVar6 = std::__cxx11::string::rfind((char)&local_2b0,0x2e);
  if (lVar6 != -1) {
    std::__cxx11::string::substr((ulong)local_230,(ulong)&local_2b0);
    std::__cxx11::string::operator=((string *)&local_2b0,(string *)local_230);
    if (local_230 != (undefined1  [8])(local_230 + 0x10)) {
      operator_delete((void *)local_230);
    }
  }
  GetBaseDir(&local_250,local_330);
  if (local_250._M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_250,0,(char *)0x0,0x30c3b8);
  }
  SerializeGltfModel(model,(json *)local_340);
  local_2f8._M_allocated_capacity = 0;
  local_2f8._8_8_ = 0;
  local_2e8 = 0;
  local_2c0[0] = null;
  local_2b8.object = (object_t *)0x0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_2c0);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_2c0);
  if ((model->buffers).super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (model->buffers).super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_2d0 = _VTT;
    local_2d8 = _recvfrom;
    uVar10 = 0;
    local_31c = (uint)CONCAT71(in_register_00000081,embedBuffers);
    do {
      local_370[0] = null;
      local_368.object = (object_t *)0x0;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_370);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_370);
      if ((char)uVar11 == '\0') {
        local_388.object = (object_t *)0x0;
        local_380._M_local_buf[0] = '\0';
        local_318._0_8_ = local_318 + 0x10;
        local_318._8_8_ = 0;
        local_318[0x10] = '\0';
        pBVar15 = (model->buffers).
                  super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_390 = (undefined1  [8])(local_390 + 0x10);
        if ((pBVar15[uVar10].uri._M_string_length == 0) ||
           (bVar2 = IsDataURI(&pBVar15[uVar10].uri), bVar2)) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_230,&local_2b0,&local_360);
          std::__cxx11::string::operator=((string *)local_318,(string *)local_230);
          if (local_230 != (undefined1  [8])(local_230 + 0x10)) {
            operator_delete((void *)local_230);
          }
          if (local_2f8._M_allocated_capacity != local_2f8._8_8_) {
            __val = 0;
            uVar14 = local_2f8._M_allocated_capacity;
            uVar16 = local_2f8._8_8_;
            do {
              iVar4 = std::__cxx11::string::compare((string *)local_318);
              if (iVar4 == 0) {
                __len = 1;
                if (9 < __val) {
                  uVar11 = (ulong)__val;
                  uVar1 = 4;
                  do {
                    __len = uVar1;
                    uVar5 = (uint)uVar11;
                    if (uVar5 < 100) {
                      __len = __len - 2;
                      goto LAB_002823c1;
                    }
                    if (uVar5 < 1000) {
                      __len = __len - 1;
                      goto LAB_002823c1;
                    }
                    if (uVar5 < 10000) goto LAB_002823c1;
                    uVar11 = uVar11 / 10000;
                    uVar1 = __len + 4;
                  } while (99999 < uVar5);
                  __len = __len + 1;
                }
LAB_002823c1:
                local_290[0] = local_280;
                std::__cxx11::string::_M_construct((ulong)local_290,(char)__len);
                std::__detail::__to_chars_10_impl<unsigned_int>(local_290[0],__len,__val);
                plVar7 = (long *)std::__cxx11::string::replace
                                           ((ulong)local_290,0,(char *)0x0,
                                            (ulong)local_2b0._M_dataplus._M_p);
                plVar12 = plVar7 + 2;
                if ((long *)*plVar7 == plVar12) {
                  local_260 = *plVar12;
                  lStack_258 = plVar7[3];
                  local_270 = &local_260;
                }
                else {
                  local_260 = *plVar12;
                  local_270 = (long *)*plVar7;
                }
                local_268 = plVar7[1];
                *plVar7 = (long)plVar12;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                puVar8 = (undefined8 *)
                         std::__cxx11::string::_M_append
                                   ((char *)&local_270,(ulong)local_360._M_dataplus._M_p);
                psVar13 = (string *)(puVar8 + 2);
                if ((string *)*puVar8 == psVar13) {
                  local_220[0]._0_8_ = (psVar13->_M_dataplus)._M_p;
                  local_220[0]._8_8_ = puVar8[3];
                  local_230 = (undefined1  [8])(local_230 + 0x10);
                }
                else {
                  local_220[0]._0_8_ = (psVar13->_M_dataplus)._M_p;
                  local_230 = (undefined1  [8])*puVar8;
                }
                local_228 = *(json_value *)(puVar8 + 1);
                *puVar8 = psVar13;
                puVar8[1] = 0;
                *(undefined1 *)(puVar8 + 2) = 0;
                std::__cxx11::string::operator=((string *)local_318,(string *)local_230);
                if (local_230 != (undefined1  [8])(local_230 + 0x10)) {
                  operator_delete((void *)local_230);
                }
                if (local_270 != &local_260) {
                  operator_delete(local_270);
                }
                if (local_290[0] != local_280) {
                  operator_delete(local_290[0]);
                }
                __val = __val + 1;
                uVar14 = local_2f8._M_allocated_capacity;
                uVar16 = local_2f8._8_8_;
              }
              else {
                uVar14 = uVar14 + 0x20;
              }
            } while (uVar14 != uVar16);
          }
        }
        else {
          std::__cxx11::string::_M_assign((string *)local_318);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_2f8,(value_type *)local_318);
        JoinPath((string *)local_230,&local_250,(string *)local_318);
        std::__cxx11::string::operator=((string *)local_390,(string *)local_230);
        if (local_230 != (undefined1  [8])(local_230 + 0x10)) {
          operator_delete((void *)local_230);
        }
        pBVar15 = (model->buffers).
                  super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar10;
        std::ofstream::ofstream(local_230,(char *)local_390,_S_bin);
        cVar3 = std::__basic_file<char>::is_open();
        if (cVar3 == '\0') {
          local_230 = (undefined1  [8])local_2d0;
          *(undefined8 *)(local_230 + local_2d0[-1]._M_string_length) = local_2d8;
          std::filebuf::~filebuf((filebuf *)(local_230 + 8));
          std::ios_base::~ios_base(local_138);
        }
        else {
          std::ostream::write(local_230,
                              *(long *)&(pBVar15->data).
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data);
          psVar13 = (string *)(local_230 + 0x10);
          std::ofstream::close();
          local_230 = (undefined1  [8])local_2d0;
          *(undefined8 *)(local_230 + local_2d0[-1]._M_string_length) = local_2d8;
          std::filebuf::~filebuf((filebuf *)(local_230 + 8));
          std::ios_base::~ios_base(local_138);
          local_220[0]._M_allocated_capacity = 0x676e654c65747962;
          local_228.number_integer = 10;
          local_220[0]._8_3_ = 0x6874;
          local_230 = (undefined1  [8])psVar13;
          SerializeNumberProperty<unsigned_long>
                    (psVar13,(long)*(pointer *)
                                    ((long)&(pBVar15->data).
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl + 8) -
                             *(long *)&(pBVar15->data).
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data,(json *)local_370);
          if (local_230 != (undefined1  [8])psVar13) {
            operator_delete((void *)local_230);
          }
          local_228.number_integer = 3;
          local_220[0]._0_4_ = 0x697275;
          local_230 = (undefined1  [8])psVar13;
          SerializeStringProperty(psVar13,(string *)local_318._0_8_,(json *)local_370);
          if (local_230 != (undefined1  [8])psVar13) {
            operator_delete((void *)local_230);
          }
          if ((pBVar15->name)._M_string_length != 0) {
            local_228.number_integer = 4;
            local_220[0]._0_5_ = 0x656d616e;
            local_230 = (undefined1  [8])psVar13;
            SerializeStringProperty
                      (psVar13,(string *)(pBVar15->name)._M_dataplus._M_p,(json *)local_370);
            if (local_230 != (undefined1  [8])psVar13) {
              operator_delete((void *)local_230);
            }
          }
          if ((char)(pBVar15->extras).type_ != '\0') {
            local_228.number_integer = 6;
            local_220[0]._0_7_ = 0x736172747865;
            local_230 = (undefined1  [8])psVar13;
            SerializeValue((string *)local_230,&pBVar15->extras,(json *)local_370);
            if (local_230 != (undefined1  [8])psVar13) {
              operator_delete((void *)local_230);
            }
          }
        }
        if ((string *)local_318._0_8_ != (string *)(local_318 + 0x10)) {
          operator_delete((void *)local_318._0_8_);
        }
        uVar11 = (ulong)local_31c;
        if (local_390 != (undefined1  [8])(local_390 + 0x10)) {
          operator_delete((void *)local_390);
        }
        if (cVar3 == '\0') {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)local_370);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::json_value::destroy((json_value *)(local_370 + 8),local_370[0]);
          bVar2 = false;
          goto LAB_00282b0c;
        }
      }
      else {
        SerializeGltfBuffer((model->buffers).
                            super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>.
                            _M_impl.super__Vector_impl_data._M_start + uVar10,
                            (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                             *)local_370);
      }
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)local_2c0,
                  (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)local_370);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_370);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)(local_370 + 8),local_370[0]);
      uVar10 = (ulong)((int)uVar10 + 1);
      uVar9 = ((long)(model->buffers).
                     super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)(model->buffers).
                     super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>._M_impl
                     .super__Vector_impl_data._M_start >> 4) * -0x1111111111111111;
    } while (uVar10 <= uVar9 && uVar9 - uVar10 != 0);
  }
  anon_unknown_58::JsonAddMember((json *)local_340,"buffers",(json *)local_2c0);
  if ((model->images).super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (model->images).super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_230 = (undefined1  [8])((ulong)local_230 & 0xffffffffffffff00);
    local_228.object = (object_t *)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_230);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_230);
    if ((model->images).super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (model->images).super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      WriteImageData = &local_2c8->WriteImageData;
      uVar11 = 0;
      bVar2 = local_324._0_1_;
      do {
        local_390 = (undefined1  [8])((ulong)local_390 & 0xffffffffffffff00);
        local_388.object = (object_t *)0x0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_390);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_390);
        UpdateImageObject((model->images).
                          super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>.
                          _M_impl.super__Vector_impl_data._M_start + uVar11,&local_250,(int)uVar11,
                          bVar2,WriteImageData,local_2c8->write_image_user_data_);
        SerializeGltfImage((model->images).
                           super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>.
                           _M_impl.super__Vector_impl_data._M_start + uVar11,
                           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_390);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)local_230,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)local_390);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_390);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)(local_390 + 8),(value_t)local_390[0]);
        uVar11 = (ulong)((int)uVar11 + 1);
        uVar10 = ((long)(model->images).
                        super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(model->images).
                        super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4fa4fa4fa4fa4fa5;
      } while (uVar11 <= uVar10 && uVar10 - uVar11 != 0);
    }
    anon_unknown_58::JsonAddMember((json *)local_340,"images",(json *)local_230);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_230);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_230 + 8),(value_t)local_230[0]);
  }
  if (writeBinary) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::dump((string_t *)local_390,
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *)local_340,-1,' ',false,strict);
    std::ofstream::ofstream(local_230,(local_330->_M_dataplus)._M_p,_S_bin);
    WriteBinaryGltfStream((ostream *)local_230,(string *)local_390);
  }
  else {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::dump((string_t *)local_390,
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *)local_340,(local_320 & 0xff) - 1 | 2,' ',false,strict);
    std::ofstream::ofstream(local_230,(local_330->_M_dataplus)._M_p,_S_out);
    cVar3 = std::__basic_file<char>::is_open();
    if (cVar3 != '\0') {
      WriteGltfStream((ostream *)local_230,(string *)local_390);
    }
  }
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_230 + _VTT[-1]._M_string_length) = _recvfrom;
  std::filebuf::~filebuf((filebuf *)(local_230 + 8));
  std::ios_base::~ios_base(local_138);
  if (local_390 != (undefined1  [8])(local_390 + 0x10)) {
    operator_delete((void *)local_390);
  }
  bVar2 = true;
LAB_00282b0c:
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_2c0);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_2c0 + 8),local_2c0[0]);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_340);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_340 + 8),local_340[0]);
  return bVar2;
}

Assistant:

bool TinyGLTF::WriteGltfSceneToFile(Model *model, const std::string &filename,
                                    bool embedImages = false,
                                    bool embedBuffers = false,
                                    bool prettyPrint = true,
                                    bool writeBinary = false) {
  JsonDocument output;
  std::string defaultBinFilename = GetBaseFilename(filename);
  std::string defaultBinFileExt = ".bin";
  std::string::size_type pos =
      defaultBinFilename.rfind('.', defaultBinFilename.length());

  if (pos != std::string::npos) {
    defaultBinFilename = defaultBinFilename.substr(0, pos);
  }
  std::string baseDir = GetBaseDir(filename);
  if (baseDir.empty()) {
    baseDir = "./";
  }
  /// Serialize all properties except buffers and images.
  SerializeGltfModel(model, output);

  // BUFFERS
  std::vector<std::string> usedUris;
  json buffers;
  JsonReserveArray(buffers, model->buffers.size());
  for (unsigned int i = 0; i < model->buffers.size(); ++i) {
    json buffer;
    if (embedBuffers) {
      SerializeGltfBuffer(model->buffers[i], buffer);
    } else {
      std::string binSavePath;
      std::string binUri;
      if (!model->buffers[i].uri.empty() && !IsDataURI(model->buffers[i].uri)) {
        binUri = model->buffers[i].uri;
      } else {
        binUri = defaultBinFilename + defaultBinFileExt;
        bool inUse = true;
        int numUsed = 0;
        while (inUse) {
          inUse = false;
          for (const std::string &usedName : usedUris) {
            if (binUri.compare(usedName) != 0) continue;
            inUse = true;
            binUri = defaultBinFilename + std::to_string(numUsed++) +
                     defaultBinFileExt;
            break;
          }
        }
      }
      usedUris.push_back(binUri);
      binSavePath = JoinPath(baseDir, binUri);
      if (!SerializeGltfBuffer(model->buffers[i], buffer, binSavePath,
                               binUri)) {
        return false;
      }
    }
    JsonPushBack(buffers, std::move(buffer));
  }
  JsonAddMember(output, "buffers", std::move(buffers));

  // IMAGES
  if (model->images.size()) {
    json images;
    JsonReserveArray(images, model->images.size());
    for (unsigned int i = 0; i < model->images.size(); ++i) {
      json image;

      UpdateImageObject(model->images[i], baseDir, int(i), embedImages,
                        &this->WriteImageData, this->write_image_user_data_);
      SerializeGltfImage(model->images[i], image);
      JsonPushBack(images, std::move(image));
    }
    JsonAddMember(output, "images", std::move(images));
  }

  if (writeBinary) {
    WriteBinaryGltfFile(filename, JsonToString(output));
  } else {
    WriteGltfFile(filename, JsonToString(output, (prettyPrint ? 2 : -1)));
  }

  return true;
}